

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::~RenderDeviceBase
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this)

{
  pointer puVar1;
  IThreadPool *pIVar2;
  IEngineFactory *pIVar3;
  string msg;
  string local_28;
  
  (this->super_ObjectBase<Diligent::IRenderDeviceVk>).
  super_RefCountedObject<Diligent::IRenderDeviceVk>.super_IRenderDeviceVk.super_IRenderDevice.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00aff858;
  if ((long)(this->m_RecycledDynamicBufferIds).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_RecycledDynamicBufferIds).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 !=
      (ulong)(this->m_NextDynamicBufferId).super___atomic_base<unsigned_int>._M_i) {
    FormatString<char[46]>(&local_28,(char (*) [46])"Not all dynamic buffer IDs have been recycled")
    ;
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~RenderDeviceBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xda);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  if ((long)(this->m_RecycledDynamicBufferIds).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_RecycledDynamicBufferIds).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 !=
      (this->m_DbgRecycledDynamicBufferIds)._M_h._M_element_count) {
    FormatString<char[146]>
              (&local_28,
               (char (*) [146])
               "Recycled dynamic buffer ID set does not match the actual number of recycled IDs. This may happen if there were duplicate IDs or because of a bug."
              );
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"~RenderDeviceBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xdc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->m_DbgRecycledDynamicBufferIds)._M_h);
  puVar1 = (this->m_RecycledDynamicBufferIds).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_RecycledDynamicBufferIds).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pIVar2 = (this->m_pShaderCompilationThreadPool).m_pObject;
  if (pIVar2 != (IThreadPool *)0x0) {
    (*(pIVar2->super_IObject)._vptr_IObject[2])();
    (this->m_pShaderCompilationThreadPool).m_pObject = (IThreadPool *)0x0;
  }
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PSOCacheAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_MemObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PipeResSignAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SBTAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TLASAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BLASAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_FramebufferAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_RenderPassAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_QueryAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_FenceAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_ResMappingAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SRBAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_PSOAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_SamplerObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_ShaderObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BuffViewObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_BufObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TexViewObjAllocator);
  FixedBlockMemoryAllocator::~FixedBlockMemoryAllocator(&this->m_TexObjAllocator);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_wpDeferredContexts);
  std::
  vector<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextVkImpl>,_Diligent::IMemoryAllocator>_>
  ::~vector(&this->m_wpImmediateContexts);
  std::_Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>::_M_deallocate
            (&(this->m_TexFmtInfoInitFlags).
              super__Bvector_base<Diligent::STDAllocator<bool,_Diligent::IMemoryAllocator>_>);
  std::
  _Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
  ::~_Vector_base(&(this->m_TextureFormatsInfo).
                   super__Vector_base<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
                 );
  std::
  _Hashtable<Diligent::SamplerDesc,_std::pair<const_Diligent::SamplerDesc,_std::shared_ptr<Diligent::ObjectsRegistry<Diligent::SamplerDesc,_Diligent::RefCntAutoPtr<Diligent::ISampler>,_std::hash<Diligent::SamplerDesc>,_std::equal_to<Diligent::SamplerDesc>_>::ObjectWrapper>_>,_std::allocator<std::pair<const_Diligent::SamplerDesc,_std::shared_ptr<Diligent::ObjectsRegistry<Diligent::SamplerDesc,_Diligent::RefCntAutoPtr<Diligent::ISampler>,_std::hash<Diligent::SamplerDesc>,_std::equal_to<Diligent::SamplerDesc>_>::ObjectWrapper>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::SamplerDesc>,_std::hash<Diligent::SamplerDesc>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_SamplersRegistry).m_Cache._M_h);
  pIVar3 = (this->m_pEngineFactory).m_pObject;
  if (pIVar3 != (IEngineFactory *)0x0) {
    (**(code **)(*(long *)pIVar3 + 0x10))();
    (this->m_pEngineFactory).m_pObject = (IEngineFactory *)0x0;
  }
  return;
}

Assistant:

~RenderDeviceBase()
    {
        VERIFY(m_RecycledDynamicBufferIds.size() == m_NextDynamicBufferId, "Not all dynamic buffer IDs have been recycled");
        VERIFY(m_RecycledDynamicBufferIds.size() == m_DbgRecycledDynamicBufferIds.size(),
               "Recycled dynamic buffer ID set does not match the actual number of recycled IDs. This may happen if there were duplicate IDs or because of a bug.");
    }